

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeIterator.cpp
# Opt level: O1

NodeIterator * __thiscall NodeIterator::operator++(NodeIterator *this)

{
  set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *psVar1;
  set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *psVar2;
  _Base_ptr p_Var3;
  iterator *piVar4;
  
  if (this->forkNode == (ForkNode *)0x0) {
    if (this->exitNode != (ExitNode *)0x0) {
      psVar2 = ExitNode::joinSuccessors(this->exitNode);
      p_Var3 = (this->joinSuccessorsIterator)._M_node;
      if ((_Rb_tree_header *)p_Var3 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header) {
        piVar4 = (iterator *)&this->joinSuccessorsIterator;
        goto LAB_00118d34;
      }
    }
  }
  else {
    psVar1 = ForkNode::forkSuccessors(this->forkNode);
    p_Var3 = (this->forkSuccessorsIterator)._M_node;
    if ((_Rb_tree_header *)p_Var3 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header) {
      piVar4 = &this->forkSuccessorsIterator;
      goto LAB_00118d34;
    }
  }
  piVar4 = (iterator *)&this->successorsIterator;
  p_Var3 = (this->successorsIterator)._M_node;
LAB_00118d34:
  p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  piVar4->_M_node = p_Var3;
  return this;
}

Assistant:

NodeIterator &NodeIterator::operator++() {
    if (forkNode) {
        if (forkSuccessorsIterator != forkNode->forkSuccessors().end()) {
            ++forkSuccessorsIterator;
            return *this;
        }
    } else if (exitNode) {
        if (joinSuccessorsIterator != exitNode->joinSuccessors().end()) {
            ++joinSuccessorsIterator;
            return *this;
        }
    }
    ++successorsIterator;
    return *this;
}